

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoThrow(Thread *this,Ptr *exn)

{
  pointer pHVar1;
  pointer *ppFVar2;
  uint uVar3;
  u32 uVar4;
  size_t sVar5;
  size_t sVar6;
  iterator __position;
  pointer pFVar7;
  bool bVar8;
  ulong extraout_RAX;
  bool bVar9;
  pointer pHVar10;
  pointer pHVar11;
  pointer pCVar12;
  uint uVar13;
  pointer pFVar14;
  Ptr func;
  Ptr exn_tag;
  Ptr catch_tag;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> handlers;
  u32 local_e8;
  RunResult local_e0;
  ulong local_d0;
  ulong local_c8;
  RefPtr<wabt::interp::DefinedFunc> local_b8;
  Ptr *local_a0;
  pointer local_98;
  pointer local_90;
  RefPtr<wabt::interp::Tag> local_88;
  RefPtr<wabt::interp::Tag> local_68;
  pointer local_50;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_48;
  
  local_a0 = exn;
  RefPtr<wabt::interp::Tag>::RefPtr(&local_88,this->store_,(Ref)(exn->obj_->tag_).index);
  local_e8 = 0xffffffff;
  bVar9 = false;
  bVar8 = false;
  local_d0 = extraout_RAX;
  local_c8 = extraout_RAX;
  do {
    pFVar14 = (this->frames_).
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_e0 = Exception;
    if ((this->frames_).
        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
        super__Vector_impl_data._M_start == pFVar14) goto LAB_001b9850;
    RefPtr<wabt::interp::DefinedFunc>::RefPtr(&local_b8,this->store_,(Ref)pFVar14[-1].func.index);
    uVar3 = pFVar14[-1].offset;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              (&local_48,&((local_b8.obj_)->desc_).handlers);
    pHVar11 = local_48.
              super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pFVar7 = pFVar14;
    if (local_48.
        super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_48.
        super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      do {
        local_90 = pFVar7;
        pHVar1 = pHVar11 + -1;
        pHVar10 = pHVar1;
        uVar13 = 0;
        if ((pHVar11[-1].try_start_offset <= uVar3) && (uVar3 < pHVar11[-1].try_end_offset)) {
          if (pHVar1->kind == Delegate) {
            pHVar10 = local_48.
                      super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      (ulong)pHVar11[-1].field_4.catch_all_offset + 1;
            uVar13 = 4;
          }
          else {
            pCVar12 = pHVar11[-1].catches.
                      super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_50 = pHVar11[-1].catches.
                       super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            local_98 = pHVar11;
            if (pCVar12 != local_50) {
              do {
                uVar4 = pCVar12->offset;
                RefPtr<wabt::interp::Tag>::RefPtr
                          (&local_68,this->store_,
                           (Ref)((pFVar14[-1].inst)->tags_).
                                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                ._M_impl.super__Vector_impl_data._M_start[pCVar12->tag_index].index)
                ;
                sVar5 = ((local_88.obj_)->super_Extern).super_Object.self_.index;
                sVar6 = ((local_68.obj_)->super_Extern).super_Object.self_.index;
                uVar13 = 0;
                if (sVar5 == sVar6) {
                  local_d0 = (ulong)local_98[-1].values;
                  local_c8 = (ulong)local_98[-1].exceptions;
                  uVar13 = 8;
                  local_e8 = uVar4;
                }
                if (local_68.obj_ != (Tag *)0x0) {
                  Store::DeleteRoot(local_68.store_,local_68.root_index_);
                  local_68.obj_ = (Tag *)0x0;
                  local_68.store_ = (Store *)0x0;
                  local_68.root_index_ = 0;
                }
                pFVar14 = local_90;
                if (sVar5 == sVar6) goto LAB_001b96f1;
                pCVar12 = pCVar12 + 1;
              } while (pCVar12 != local_50);
            }
            uVar13 = 6;
LAB_001b96f1:
            pHVar10 = local_98;
            if ((uVar13 == 6) &&
               (pHVar10 = pHVar1, uVar13 = 0, local_98[-1].field_4.catch_all_offset != 0xffffffff))
            {
              local_d0 = (ulong)local_98[-1].values;
              local_c8 = (ulong)local_98[-1].exceptions;
              bVar9 = true;
              uVar13 = 8;
              pHVar10 = local_98;
              local_e8 = local_98[-1].field_4.catch_all_offset;
            }
          }
        }
        if ((uVar13 & 0xb) != 0) goto LAB_001b975b;
        pHVar11 = pHVar10;
        pFVar7 = local_90;
      } while (pHVar10 !=
               local_48.
               super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    ppFVar2 = &(this->frames_).
               super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl
               .super__Vector_impl_data._M_finish;
    *ppFVar2 = *ppFVar2 + -1;
    bVar8 = true;
    uVar13 = 0;
LAB_001b975b:
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_48);
    if (local_b8.obj_ != (DefinedFunc *)0x0) {
      Store::DeleteRoot(local_b8.store_,local_b8.root_index_);
      local_b8.obj_ = (DefinedFunc *)0x0;
      local_b8.store_ = (Store *)0x0;
      local_b8.root_index_ = 0;
    }
  } while (uVar13 == 0);
  if (uVar13 == 8) {
    if (local_e8 == 0xffffffff) {
      __assert_fail("target_offset != Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                    ,0xa53,"RunResult wabt::interp::Thread::DoThrow(Exception::Ptr)");
    }
    pFVar14 = (this->frames_).
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (bVar8) {
      this->inst_ = pFVar14[-1].inst;
      this->mod_ = pFVar14[-1].mod;
    }
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize
              (&this->values_,(ulong)((int)local_d0 + pFVar14[-1].values));
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
              (&this->exceptions_,(ulong)((int)local_c8 + pFVar14[-1].exceptions));
    pFVar14[-1].offset = local_e8;
    local_b8.obj_ = (DefinedFunc *)RefPtr<wabt::interp::Exception>::ref(local_a0);
    __position._M_current =
         (this->exceptions_).
         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->exceptions_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
      _M_realloc_insert<wabt::interp::Ref>(&this->exceptions_,__position,(Ref *)&local_b8);
    }
    else {
      (__position._M_current)->index = (size_t)local_b8.obj_;
      (this->exceptions_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_e0 = Ok;
    if (!bVar9) {
      PushValues(this,&((local_88.obj_)->type_).signature,&local_a0->obj_->args_);
    }
  }
LAB_001b9850:
  if (local_88.obj_ != (Tag *)0x0) {
    Store::DeleteRoot(local_88.store_,local_88.root_index_);
  }
  return local_e0;
}

Assistant:

RunResult Thread::DoThrow(Exception::Ptr exn) {
  Istream::Offset target_offset = Istream::kInvalidOffset;
  u32 target_values, target_exceptions;
  Tag::Ptr exn_tag{store_, exn->tag()};
  bool popped_frame = false;
  bool had_catch_all = false;

  // DoThrow is responsible for unwinding the stack at the point at which an
  // exception is thrown, and also branching to the appropriate catch within
  // the target try-catch. In a compiler, the tag dispatch might be done in
  // generated code in a landing pad, but this is easier for the interpreter.
  while (!frames_.empty()) {
    const Frame& frame = frames_.back();
    DefinedFunc::Ptr func{store_, frame.func};
    u32 pc = frame.offset;
    auto handlers = func->desc().handlers;

    // We iterate in reverse order, in order to traverse handlers from most
    // specific (pushed last) to least specific within a nested stack of
    // try-catch blocks.
    auto iter = handlers.rbegin();
    while (iter != handlers.rend()) {
      const HandlerDesc& handler = *iter;
      if (pc >= handler.try_start_offset && pc < handler.try_end_offset) {
        // For a try-delegate, skip part of the traversal by directly going
        // up to an outer handler specified by the delegate depth.
        if (handler.kind == HandlerKind::Delegate) {
          // Subtract one as we're trying to get a reverse iterator that is
          // offset by `delegate_handler_index` from the first item.
          iter = handlers.rend() - handler.delegate_handler_index - 1;
          continue;
        }
        // Otherwise, check for a matching catch tag or catch_all.
        for (auto _catch : handler.catches) {
          // Here we have to be careful to use the target frame's instance
          // to look up the tag rather than the throw's instance.
          Ref catch_tag_ref = frame.inst->tags()[_catch.tag_index];
          Tag::Ptr catch_tag{store_, catch_tag_ref};
          if (exn_tag == catch_tag) {
            target_offset = _catch.offset;
            target_values = (*iter).values;
            target_exceptions = (*iter).exceptions;
            goto found_handler;
          }
        }
        if (handler.catch_all_offset != Istream::kInvalidOffset) {
          target_offset = handler.catch_all_offset;
          target_values = (*iter).values;
          target_exceptions = (*iter).exceptions;
          had_catch_all = true;
          goto found_handler;
        }
      }
      iter++;
    }
    frames_.pop_back();
    popped_frame = true;
  }

  // If the call frames are empty now, the exception is uncaught.
  assert(frames_.empty());
  return RunResult::Exception;

found_handler:
  assert(target_offset != Istream::kInvalidOffset);

  Frame& target_frame = frames_.back();
  // If the throw crosses call frames, we need to reset the state to that
  // call frame's values. The stack heights may need to be offset by the
  // handler's heights as we may be jumping into the middle of the function
  // code after some stack height changes.
  if (popped_frame) {
    inst_ = target_frame.inst;
    mod_ = target_frame.mod;
  }
  values_.resize(target_frame.values + target_values);
  exceptions_.resize(target_frame.exceptions + target_exceptions);
  // Jump to the handler.
  target_frame.offset = target_offset;
  // When an exception is caught, it needs to be tracked in a stack
  // to allow for rethrows. This stack is popped on leaving the try-catch
  // or by control instructions such as `br`.
  exceptions_.push_back(exn.ref());
  // Also push exception payload values if applicable.
  if (!had_catch_all) {
    PushValues(exn_tag->type().signature, exn->args());
  }
  return RunResult::Ok;
}